

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtrFactory
          (WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *this,
          ConsumerEndpointImpl *owner)

{
  ConsumerEndpointImpl **__p;
  shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*> local_28;
  ConsumerEndpointImpl *local_18;
  ConsumerEndpointImpl *owner_local;
  WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *this_local;
  
  local_18 = owner;
  owner_local = (ConsumerEndpointImpl *)this;
  __p = (ConsumerEndpointImpl **)operator_new(8);
  *__p = local_18;
  ::std::shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl*>::
  shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl*,void>
            ((shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl*> *)&local_28,__p);
  WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtr(&this->weak_ptr_,&local_28);
  std::shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*>::~shared_ptr(&local_28);
  return;
}

Assistant:

explicit WeakPtrFactory(T* owner)
      : weak_ptr_(std::shared_ptr<T*>(new T* {owner})) {
    PERFETTO_DCHECK_THREAD(thread_checker);
  }